

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  stbi_uc *psVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  byte bVar21;
  uint uVar22;
  long lVar24;
  stbi_uc *psVar25;
  byte *pbVar26;
  uint uVar27;
  uint uVar28;
  stbi_uc *psVar29;
  byte *pbVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  long in_FS_OFFSET;
  bool bVar35;
  ulong local_c0;
  ulong local_60;
  ulong uVar23;
  
  bVar35 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar35;
  a_00 = a->s->img_n;
  uVar28 = a_00 << bVar35;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                  ,0x1237,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar35,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    pcVar9 = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      pcVar9 = "too large";
    }
    else {
      lVar12 = (long)a_00;
      iVar6 = a_00 * x;
      uVar22 = iVar6 * depth + 7U >> 3;
      uVar23 = (ulong)uVar22;
      if ((uVar22 + 1) * y <= raw_len) {
        if (y != 0) {
          lVar33 = (long)(out_n << bVar35);
          iVar7 = x - 1;
          lVar10 = -lVar33;
          lVar18 = -(ulong)uVar5;
          uVar19 = 0;
          local_c0 = 0;
          local_60 = (ulong)x;
          do {
            pbVar30 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              psVar8 = a->out + uVar5 * (int)local_c0;
              if (depth < 8) {
                if (x < uVar22) {
                  pcVar9 = "invalid width";
                  goto LAB_0012ca64;
                }
                psVar8 = psVar8 + (uVar4 - uVar22);
                uVar28 = 1;
                local_60 = uVar23;
              }
              if (local_c0 == 0) {
                bVar2 = ""[bVar2];
              }
              if (0 < (int)uVar28) {
                uVar34 = 0;
                do {
                  switch(bVar2) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar3 = pbVar30[uVar34];
                    goto LAB_0012caff;
                  case 2:
                  case 4:
                    bVar3 = psVar8[uVar34 + lVar18];
                    break;
                  case 3:
                    bVar3 = psVar8[uVar34 + lVar18] >> 1;
                    break;
                  default:
                    goto switchD_0012cae5_default;
                  }
                  bVar3 = bVar3 + pbVar30[uVar34];
LAB_0012caff:
                  psVar8[uVar34] = bVar3;
switchD_0012cae5_default:
                  uVar34 = uVar34 + 1;
                } while (uVar28 != uVar34);
              }
              if (depth == 8) {
                lVar24 = (long)out_n;
                lVar20 = lVar12;
                if (a_00 != out_n) {
                  psVar8[lVar12] = 0xff;
                }
LAB_0012cb4c:
                pbVar30 = pbVar30 + lVar20;
              }
              else {
                if (depth == 0x10) {
                  lVar20 = (long)(int)uVar28;
                  lVar24 = lVar33;
                  if (a_00 != out_n) {
                    (psVar8 + lVar20)[0] = 0xff;
                    (psVar8 + lVar20)[1] = 0xff;
                  }
                  goto LAB_0012cb4c;
                }
                pbVar30 = raw + 2;
                lVar24 = 1;
              }
              psVar29 = psVar8 + lVar24;
              if (depth < 8 || a_00 == out_n) {
                uVar11 = ((int)local_60 + -1) * uVar28;
                switch(bVar2) {
                case 0:
                  memcpy(psVar29,pbVar30,(long)(int)uVar11);
                  break;
                case 1:
                  if (0 < (int)uVar11) {
                    uVar34 = 0;
                    do {
                      psVar29[uVar34] = psVar8[uVar34 + (lVar24 - (int)uVar28)] + pbVar30[uVar34];
                      uVar34 = uVar34 + 1;
                    } while (uVar11 != uVar34);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar11) {
                    uVar34 = 0;
                    do {
                      psVar29[uVar34] = psVar29[uVar34 + lVar18] + pbVar30[uVar34];
                      uVar34 = uVar34 + 1;
                    } while (uVar11 != uVar34);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar11) {
                    uVar34 = 0;
                    do {
                      psVar29[uVar34] =
                           (char)((uint)psVar8[uVar34 + (lVar24 - (int)uVar28)] +
                                  (uint)psVar29[uVar34 + lVar18] >> 1) + pbVar30[uVar34];
                      uVar34 = uVar34 + 1;
                    } while (uVar11 != uVar34);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar11) {
                    pbVar26 = psVar8 + (lVar24 - (int)uVar28);
                    uVar34 = 0;
                    do {
                      bVar2 = *pbVar26;
                      bVar3 = psVar29[lVar18];
                      bVar21 = pbVar26[lVar18];
                      iVar15 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar21;
                      uVar27 = iVar15 - (uint)bVar2;
                      uVar31 = -uVar27;
                      if (0 < (int)uVar27) {
                        uVar31 = uVar27;
                      }
                      uVar14 = iVar15 - (uint)bVar3;
                      uVar27 = -uVar14;
                      if (0 < (int)uVar14) {
                        uVar27 = uVar14;
                      }
                      uVar16 = iVar15 - (uint)bVar21;
                      uVar14 = -uVar16;
                      if (0 < (int)uVar16) {
                        uVar14 = uVar16;
                      }
                      if (uVar27 <= uVar14) {
                        bVar21 = bVar3;
                      }
                      if (uVar14 < uVar31) {
                        bVar2 = bVar21;
                      }
                      if (uVar27 < uVar31) {
                        bVar2 = bVar21;
                      }
                      *psVar29 = bVar2 + pbVar30[uVar34];
                      uVar34 = uVar34 + 1;
                      pbVar26 = pbVar26 + 1;
                      psVar29 = psVar29 + 1;
                    } while (uVar11 != uVar34);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar11) {
                    uVar34 = 0;
                    do {
                      psVar29[uVar34] =
                           (psVar8[uVar34 + (lVar24 - (int)uVar28)] >> 1) + pbVar30[uVar34];
                      uVar34 = uVar34 + 1;
                    } while (uVar11 != uVar34);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar11) {
                    uVar34 = 0;
                    do {
                      psVar29[uVar34] = psVar8[uVar34 + (lVar24 - (int)uVar28)] + pbVar30[uVar34];
                      uVar34 = uVar34 + 1;
                    } while (uVar11 != uVar34);
                  }
                }
                pbVar30 = pbVar30 + (int)uVar11;
                bVar35 = true;
              }
              else {
                if (a_00 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                                ,0x128b,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                switch(bVar2) {
                case 0:
                  if (iVar7 != 0) {
                    iVar15 = iVar7;
                    do {
                      if (0 < (int)uVar28) {
                        uVar34 = 0;
                        do {
                          psVar29[uVar34] = pbVar30[uVar34];
                          uVar34 = uVar34 + 1;
                        } while (uVar28 != uVar34);
                      }
                      psVar29[(int)uVar28] = 0xff;
                      pbVar30 = pbVar30 + (int)uVar28;
                      psVar29 = psVar29 + lVar33;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  break;
                case 1:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar24 + lVar10;
                    iVar15 = iVar7;
                    do {
                      if (0 < (int)uVar28) {
                        uVar34 = 0;
                        do {
                          psVar29[uVar34] = psVar8[uVar34] + pbVar30[uVar34];
                          uVar34 = uVar34 + 1;
                        } while (uVar28 != uVar34);
                      }
                      psVar29[(int)uVar28] = 0xff;
                      pbVar30 = pbVar30 + (int)uVar28;
                      psVar29 = psVar29 + lVar33;
                      psVar8 = psVar8 + lVar33;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  break;
                case 2:
                  if (iVar7 != 0) {
                    iVar15 = iVar7;
                    do {
                      if (0 < (int)uVar28) {
                        uVar34 = 0;
                        do {
                          psVar29[uVar34] = psVar29[uVar34 + lVar18] + pbVar30[uVar34];
                          uVar34 = uVar34 + 1;
                        } while (uVar28 != uVar34);
                      }
                      psVar29[(int)uVar28] = 0xff;
                      pbVar30 = pbVar30 + (int)uVar28;
                      psVar29 = psVar29 + lVar33;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  break;
                case 3:
                  if (iVar7 != 0) {
                    iVar15 = iVar7;
                    do {
                      if (0 < (int)uVar28) {
                        uVar34 = 0;
                        psVar8 = psVar29;
                        do {
                          *psVar8 = (char)((uint)psVar8[lVar10] + (uint)psVar8[lVar18] >> 1) +
                                    pbVar30[uVar34];
                          uVar34 = uVar34 + 1;
                          psVar8 = psVar8 + 1;
                        } while (uVar28 != uVar34);
                      }
                      psVar29[(int)uVar28] = 0xff;
                      pbVar30 = pbVar30 + (int)uVar28;
                      psVar29 = psVar29 + lVar33;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  break;
                case 4:
                  if (iVar7 != 0) {
                    psVar13 = psVar8 + lVar24 + lVar18;
                    psVar25 = psVar8 + lVar24 + lVar10;
                    psVar8 = psVar8 + lVar24 + (lVar10 - (ulong)uVar5);
                    iVar15 = iVar7;
                    do {
                      if (0 < (int)uVar28) {
                        uVar34 = 0;
                        do {
                          bVar2 = psVar25[uVar34];
                          bVar3 = psVar13[uVar34];
                          bVar21 = psVar8[uVar34];
                          iVar17 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar21;
                          uVar31 = iVar17 - (uint)bVar2;
                          uVar11 = -uVar31;
                          if (0 < (int)uVar31) {
                            uVar11 = uVar31;
                          }
                          uVar27 = iVar17 - (uint)bVar3;
                          uVar31 = -uVar27;
                          if (0 < (int)uVar27) {
                            uVar31 = uVar27;
                          }
                          uVar14 = iVar17 - (uint)bVar21;
                          uVar27 = -uVar14;
                          if (0 < (int)uVar14) {
                            uVar27 = uVar14;
                          }
                          if (uVar31 <= uVar27) {
                            bVar21 = bVar3;
                          }
                          if (uVar27 < uVar11) {
                            bVar2 = bVar21;
                          }
                          if (uVar31 < uVar11) {
                            bVar2 = bVar21;
                          }
                          psVar29[uVar34] = bVar2 + pbVar30[uVar34];
                          uVar34 = uVar34 + 1;
                        } while (uVar28 != uVar34);
                      }
                      psVar29[(int)uVar28] = 0xff;
                      pbVar30 = pbVar30 + (int)uVar28;
                      psVar29 = psVar29 + lVar33;
                      psVar13 = psVar13 + lVar33;
                      psVar25 = psVar25 + lVar33;
                      psVar8 = psVar8 + lVar33;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  break;
                case 5:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar24 + lVar10;
                    iVar15 = iVar7;
                    do {
                      if (0 < (int)uVar28) {
                        uVar34 = 0;
                        do {
                          psVar29[uVar34] = (psVar8[uVar34] >> 1) + pbVar30[uVar34];
                          uVar34 = uVar34 + 1;
                        } while (uVar28 != uVar34);
                      }
                      psVar29[(int)uVar28] = 0xff;
                      pbVar30 = pbVar30 + (int)uVar28;
                      psVar29 = psVar29 + lVar33;
                      psVar8 = psVar8 + lVar33;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  break;
                case 6:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar24 + lVar10;
                    iVar15 = iVar7;
                    do {
                      if (0 < (int)uVar28) {
                        uVar34 = 0;
                        do {
                          psVar29[uVar34] = psVar8[uVar34] + pbVar30[uVar34];
                          uVar34 = uVar34 + 1;
                        } while (uVar28 != uVar34);
                      }
                      psVar29[(int)uVar28] = 0xff;
                      pbVar30 = pbVar30 + (int)uVar28;
                      psVar29 = psVar29 + lVar33;
                      psVar8 = psVar8 + lVar33;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                }
                bVar35 = true;
                if ((depth == 0x10) && (x != 0)) {
                  psVar8 = a->out + (long)(int)uVar28 + (ulong)uVar19 + 1;
                  uVar34 = (ulong)x;
                  do {
                    *psVar8 = 0xff;
                    psVar8 = psVar8 + lVar33;
                    uVar11 = (int)uVar34 - 1;
                    uVar34 = (ulong)uVar11;
                  } while (uVar11 != 0);
                }
              }
            }
            else {
              pcVar9 = "invalid filter";
LAB_0012ca64:
              *(char **)(in_FS_OFFSET + -0x20) = pcVar9;
              bVar35 = false;
            }
            if (!bVar35) {
              return 0;
            }
            local_c0 = local_c0 + 1;
            uVar19 = uVar19 + uVar5;
            raw = pbVar30;
          } while (local_c0 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar4 * y != 0) {
            psVar8 = a->out;
            lVar12 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar12 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar12 = lVar12 + 1;
            } while (uVar4 * y != (int)lVar12);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar28 = x - 1;
        lVar12 = uVar4 - uVar23;
        lVar10 = (ulong)uVar28 + 1;
        uVar22 = 0;
        uVar34 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar26 = psVar8 + uVar5 * (int)uVar34;
          pbVar30 = pbVar26 + (uVar4 - uVar23);
          uVar32 = (ulong)uVar22;
          if (depth == 4) {
            iVar7 = iVar6;
            if (1 < iVar6) {
              psVar29 = psVar8 + lVar12;
              iVar15 = iVar6;
              do {
                psVar8[uVar32] = (psVar29[uVar32] >> 4) * bVar2;
                psVar8[uVar32 + 1] = (psVar29[uVar32] & 0xf) * bVar2;
                iVar7 = iVar15 + -2;
                psVar29 = psVar29 + 1;
                psVar8 = psVar8 + 2;
                bVar35 = 3 < iVar15;
                iVar15 = iVar7;
              } while (bVar35);
              pbVar30 = psVar29 + uVar32;
              pbVar26 = psVar8 + uVar32;
            }
            if (iVar7 == 1) {
              bVar3 = *pbVar30 >> 4;
LAB_0012d3ad:
              bVar2 = bVar3 * bVar2;
LAB_0012d3b0:
              *pbVar26 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar7 = iVar6;
            if (3 < iVar6) {
              psVar29 = psVar8 + lVar12;
              iVar15 = iVar6;
              do {
                psVar8[uVar32] = (psVar29[uVar32] >> 6) * bVar2;
                psVar8[uVar32 + 1] = (psVar29[uVar32] >> 4 & 3) * bVar2;
                psVar8[uVar32 + 2] = (psVar29[uVar32] >> 2 & 3) * bVar2;
                psVar8[uVar32 + 3] = (psVar29[uVar32] & 3) * bVar2;
                iVar7 = iVar15 + -4;
                psVar29 = psVar29 + 1;
                psVar8 = psVar8 + 4;
                bVar35 = 7 < iVar15;
                iVar15 = iVar7;
              } while (bVar35);
              pbVar30 = psVar29 + uVar32;
              pbVar26 = psVar8 + uVar32;
            }
            if (0 < iVar7) {
              *pbVar26 = (*pbVar30 >> 6) * bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (1 < iVar7) {
              *pbVar26 = (*pbVar30 >> 4 & 3) * bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (iVar7 == 3) {
              bVar3 = *pbVar30 >> 2 & 3;
              goto LAB_0012d3ad;
            }
          }
          else if (depth == 1) {
            iVar7 = iVar6;
            if (7 < iVar6) {
              psVar29 = psVar8 + lVar12;
              iVar15 = iVar6;
              do {
                psVar8[uVar32] = (char)psVar29[uVar32] >> 7 & bVar2;
                psVar8[uVar32 + 1] = (char)(psVar29[uVar32] * '\x02') >> 7 & bVar2;
                psVar8[uVar32 + 2] = (char)(psVar29[uVar32] << 2) >> 7 & bVar2;
                psVar8[uVar32 + 3] = (char)(psVar29[uVar32] << 3) >> 7 & bVar2;
                psVar8[uVar32 + 4] = (char)(psVar29[uVar32] << 4) >> 7 & bVar2;
                psVar8[uVar32 + 5] = (char)(psVar29[uVar32] << 5) >> 7 & bVar2;
                psVar8[uVar32 + 6] = (char)(psVar29[uVar32] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar29[uVar32] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar32 + 7] = bVar3;
                iVar7 = iVar15 + -8;
                psVar29 = psVar29 + 1;
                psVar8 = psVar8 + 8;
                bVar35 = 0xf < iVar15;
                iVar15 = iVar7;
              } while (bVar35);
              pbVar30 = psVar29 + uVar32;
              pbVar26 = psVar8 + uVar32;
            }
            if (0 < iVar7) {
              *pbVar26 = (char)*pbVar30 >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (1 < iVar7) {
              *pbVar26 = (char)(*pbVar30 * '\x02') >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (2 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 2) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (3 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 3) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (4 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 4) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (5 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 5) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (iVar7 == 7) {
              bVar2 = (char)(*pbVar30 << 6) >> 7 & bVar2;
              goto LAB_0012d3b0;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar18 = lVar10;
              if (-1 < (int)uVar28) {
                do {
                  psVar8[lVar18 * 2 + (uVar32 - 1)] = 0xff;
                  psVar8[lVar18 * 2 + (uVar32 - 2)] = psVar8[lVar18 + (uVar32 - 1)];
                  lVar33 = lVar18 + -1;
                  bVar35 = 0 < lVar18;
                  lVar18 = lVar33;
                } while (lVar33 != 0 && bVar35);
              }
            }
            else {
              if (a_00 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                              ,0x12e4,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              if (-1 < (int)uVar28) {
                psVar29 = psVar8 + (ulong)uVar28 * 3 + 2 + uVar32;
                lVar18 = lVar10;
                do {
                  psVar8[lVar18 * 4 + (uVar32 - 1)] = 0xff;
                  psVar8[lVar18 * 4 + (uVar32 - 2)] = *psVar29;
                  psVar8[lVar18 * 4 + (uVar32 - 3)] = psVar29[-1];
                  psVar8[lVar18 * 4 + (uVar32 - 4)] = psVar29[-2];
                  psVar29 = psVar29 + -3;
                  lVar33 = lVar18 + -1;
                  bVar35 = 0 < lVar18;
                  lVar18 = lVar33;
                } while (lVar33 != 0 && bVar35);
              }
            }
          }
          uVar34 = uVar34 + 1;
          uVar22 = uVar22 + uVar5;
          if (uVar34 == y) {
            return 1;
          }
        } while( true );
      }
      pcVar9 = "not enough pixels";
    }
  }
  *(char **)(in_FS_OFFSET + -0x20) = pcVar9;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }